

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

void deqp::RobustBufferAccessBehavior::Shader::Compile(Functions *gl,GLuint id)

{
  GLenum GVar1;
  TestError *this;
  GLint length;
  GLint status;
  string message;
  
  status = 0;
  (*gl->compileShader)(id);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"CompileShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x224);
  (*gl->getShaderiv)(id,0x8b81,&status);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x228);
  if (status == 1) {
    return;
  }
  length = 0;
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  (*gl->getShaderiv)(id,0x8b84,&length);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x232);
  std::__cxx11::string::resize((ulong)&message,(char)length);
  (*gl->getShaderInfoLog)(id,length,(GLsizei *)0x0,message._M_dataplus._M_p);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetShaderInfoLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x239);
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,message._M_dataplus._M_p,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
             ,0x23b);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Shader::Compile(const glw::Functions& gl, glw::GLuint id)
{
	GLint status = GL_FALSE;

	/* Compile */
	gl.compileShader(id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CompileShader");

	/* Get compilation status */
	gl.getShaderiv(id, GL_COMPILE_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

	/* Log compilation error */
	if (GL_TRUE != status)
	{
		glw::GLint  length = 0;
		std::string message;

		/* Error log length */
		gl.getShaderiv(id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Prepare storage */
		message.resize(length, 0);

		/* Get error log */
		gl.getShaderInfoLog(id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

		TCU_FAIL(message.c_str());
	}
}